

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O3

int If_CluHashFindMedian(If_Man_t *p,int t)

{
  int *piVar1;
  long lVar2;
  uint uVar3;
  bool bVar4;
  uint *__ptr;
  void *__ptr_00;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  size_t __size;
  long lVar9;
  long *plVar10;
  uint uVar11;
  uint uVar12;
  
  __ptr = (uint *)malloc(0x10);
  *__ptr = 1000;
  __ptr_00 = calloc(1,4000);
  uVar11 = 1000;
  *(void **)(__ptr + 2) = __ptr_00;
  __ptr[1] = 1000;
  iVar6 = p->nTableSize[t];
  if (iVar6 < 1) {
    uVar7 = 0;
LAB_003813e1:
    uVar11 = uVar7;
    if (__ptr_00 == (void *)0x0) goto LAB_003813f9;
  }
  else {
    lVar9 = 0;
    uVar12 = 1000;
    iVar8 = 0;
    uVar7 = 0;
    do {
      plVar10 = (long *)p->pHashTable[t][lVar9];
      if (plVar10 != (long *)0x0) {
        do {
          uVar3 = *(uint *)((long)plVar10 + 0xc);
          uVar5 = uVar3;
          if ((int)uVar7 < (int)uVar3) {
            if ((int)uVar12 <= (int)uVar3) {
              lVar2 = (ulong)uVar3 + 1;
              uVar7 = uVar11 * 2;
              uVar5 = (uint)lVar2;
              if ((int)uVar3 < (int)uVar7) {
                if ((int)uVar11 <= (int)uVar3) {
                  if (__ptr_00 == (void *)0x0) {
                    __ptr_00 = malloc((ulong)uVar7 << 2);
                  }
                  else {
                    __ptr_00 = realloc(__ptr_00,(ulong)uVar7 << 2);
                  }
                  *(void **)(__ptr + 2) = __ptr_00;
                  uVar11 = uVar7;
LAB_00381304:
                  if (__ptr_00 == (void *)0x0) {
                    __assert_fail("p->pArray",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                                  ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
                  }
                  *__ptr = uVar11;
                }
              }
              else if ((int)uVar11 <= (int)uVar3) {
                __size = lVar2 * 4;
                if (__ptr_00 == (void *)0x0) {
                  __ptr_00 = malloc(__size);
                }
                else {
                  __ptr_00 = realloc(__ptr_00,__size);
                }
                *(void **)(__ptr + 2) = __ptr_00;
                uVar11 = uVar5;
                goto LAB_00381304;
              }
              memset((void *)((long)__ptr_00 + (long)(int)uVar12 * 4),0,
                     (ulong)(uVar3 - uVar12) * 4 + 4);
              __ptr[1] = uVar5;
            }
            *(undefined4 *)((long)__ptr_00 + (ulong)uVar3 * 4) = 0;
            uVar5 = *(uint *)((long)plVar10 + 0xc);
            uVar7 = uVar3;
          }
          if (((int)uVar5 < 0) || (uVar12 = __ptr[1], (int)uVar12 <= (int)uVar5)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
          }
          piVar1 = (int *)((long)__ptr_00 + (ulong)uVar5 * 4);
          *piVar1 = *piVar1 + 1;
          iVar8 = iVar8 + 1;
          plVar10 = (long *)*plVar10;
        } while (plVar10 != (long *)0x0);
        iVar6 = p->nTableSize[t];
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar6);
    if ((int)uVar7 < 1) goto LAB_003813e1;
    iVar6 = 0;
    uVar11 = uVar7;
    do {
      if ((int)uVar12 <= (int)uVar7) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar6 = iVar6 + *(int *)((long)__ptr_00 + (ulong)uVar11 * 4);
      if (iVar8 / 2 < iVar6) goto LAB_003813e9;
      bVar4 = 1 < (int)uVar11;
      uVar11 = uVar11 - 1;
    } while (bVar4);
    uVar11 = 0;
  }
LAB_003813e9:
  uVar7 = uVar11;
  free(__ptr_00);
LAB_003813f9:
  free(__ptr);
  uVar11 = 1;
  if (1 < (int)uVar7) {
    uVar11 = uVar7;
  }
  return uVar11;
}

Assistant:

int If_CluHashFindMedian( If_Man_t * p, int t )
{
    If_Hte_t * pEntry;
    Vec_Int_t * vCounters;
    int i, Max = 0, Total = 0, Half = 0;
    vCounters = Vec_IntStart( 1000 );
    for ( i = 0; i < p->nTableSize[t]; i++ )
    {
        for ( pEntry = ((If_Hte_t **)p->pHashTable[t])[i]; pEntry; pEntry = pEntry->pNext )
        {
            if ( Max < (int)pEntry->Counter )
            {
                Max = pEntry->Counter;
                Vec_IntSetEntry( vCounters, pEntry->Counter, 0 );
            }
            Vec_IntAddToEntry( vCounters, pEntry->Counter, 1 );
            Total++;
        }
    }
    for ( i = Max; i > 0; i-- )
    {
        Half += Vec_IntEntry( vCounters, i );
        if ( Half > Total/2 )
            break;
    }
/*
    printf( "total = %d  ", Total );
    printf( "half = %d  ", Half );
    printf( "i = %d  ", i );
    printf( "Max = %d.\n", Max );
*/
    Vec_IntFree( vCounters );
    return Abc_MaxInt( i, 1 );
}